

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O3

string * __thiscall
ser::OffsetTable::ToString_abi_cxx11_(string *__return_storage_ptr__,OffsetTable *this)

{
  pointer pmVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  uint uVar4;
  double dVar5;
  ostringstream ss;
  ulong local_1f0;
  string local_1c8;
  long local_1a8 [2];
  long alStack_198 [12];
  ios_base local_138 [264];
  
  uVar4 = (int)((long)(this->savepoints_).
                      super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->savepoints_).
                      super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) * -0x33333333;
  dVar5 = log10((double)(int)uVar4);
  dVar5 = ceil(dVar5);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"OffsetTable {\n",0xe);
  if (0 < (int)uVar4) {
    local_1f0 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      *(long *)((long)alStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)(int)dVar5;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      Savepoint::ToString_abi_cxx11_
                (&local_1c8,
                 (this->savepoints_).
                 super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
                 super__Vector_impl_data._M_start + local_1f0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      pmVar1 = (this->entries_).
               super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"( ",2);
      for (p_Var3 = *(_Base_ptr *)
                     ((long)&pmVar1[local_1f0]._M_t._M_impl.super__Rb_tree_header + 0x10);
          p_Var3 != &pmVar1[local_1f0]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")\n",2);
      local_1f0 = local_1f0 + 1;
    } while (local_1f0 != (uVar4 & 0x7fffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string OffsetTable::ToString() const
{
    const int size = savepoints_.size();
    const int width = std::ceil(std::log10(static_cast<double>(size)));

    std::ostringstream ss;

    ss << "OffsetTable {\n";
    for (int i = 0; i < size; ++i)
    {
        // Print savepoint
        ss << "  " << std::setw(width) << i << ": " << savepoints_[i].ToString() << "  ";

        // Print offsets
        const OffsetTableEntry& entry = entries_[i];
        ss << "( ";
        for (const_iterator iter = entry.begin(); iter != entry.end(); ++iter)
            ss << iter->first << ":" << iter->second.offset << " ";
        ss << ")\n";
    }
    ss << "}\n";

    return ss.str();
}